

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O2

string * __thiscall
cfd::core::Privkey::ConvertWif_abi_cxx11_
          (string *__return_storage_ptr__,Privkey *this,NetType net_type,bool is_compressed)

{
  int iVar1;
  size_t priv_key_len;
  CfdException *this_00;
  char *wally_string;
  int ret;
  char *wif_ptr;
  string local_d8;
  CfdSourceLocation local_b8;
  KeyFormatData format_data;
  
  GetKeyFormatData(&format_data,net_type);
  wif_ptr = (char *)0x0;
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d8,&this->data_
                    );
  priv_key_len = ByteData::GetDataSize(&this->data_);
  iVar1 = wally_wif_from_bytes
                    ((uchar *)local_d8._M_dataplus._M_p,priv_key_len,(uint)format_data.wif_prefix_,
                     (uint)!is_compressed,&wif_ptr);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d8);
  ret = iVar1;
  if (iVar1 == 0) {
    WallyUtil::ConvertStringAndFree_abi_cxx11_
              (__return_storage_ptr__,(WallyUtil *)wif_ptr,wally_string);
    KeyFormatData::~KeyFormatData(&format_data);
    return __return_storage_ptr__;
  }
  local_b8.filename = "cfdcore_key.cpp";
  local_b8.line = 0x2a6;
  local_b8.funcname = "ConvertWif";
  ByteData::GetHex_abi_cxx11_(&local_d8,&this->data_);
  logger::warn<int&,std::__cxx11::string>
            (&local_b8,"wally_wif_from_bytes error. ret={} bytes={}.",&ret,&local_d8);
  ::std::__cxx11::string::~string((string *)&local_d8);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&local_d8,"Error Private key to WIF.",(allocator *)&local_b8);
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_d8);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

std::string Privkey::ConvertWif(NetType net_type, bool is_compressed) const {
  auto format_data = GetKeyFormatData(net_type);
  uint32_t prefix = format_data.GetWifPrefix();
  uint32_t flags =
      (is_compressed ? WALLY_WIF_FLAG_COMPRESSED
                     : WALLY_WIF_FLAG_UNCOMPRESSED);
  char *wif_ptr = NULL;

  int ret = wally_wif_from_bytes(
      data_.GetBytes().data(), data_.GetDataSize(), prefix, flags, &wif_ptr);
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE, "wally_wif_from_bytes error. ret={} bytes={}.", ret,
        data_.GetHex());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Error Private key to WIF.");
  }
  std::string wif = WallyUtil::ConvertStringAndFree(wif_ptr);
  return wif;
}